

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForService
          (Generator *this,ServiceDescriptor *service_descriptor)

{
  bool bVar1;
  int iVar2;
  ServiceOptions *this_00;
  MethodOptions *this_01;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string method_name;
  undefined1 local_b0 [8];
  string method_options;
  MethodDescriptor *method;
  int i;
  string local_78;
  undefined1 local_58 [8];
  string service_options;
  string descriptor_name;
  ServiceDescriptor *service_descriptor_local;
  Generator *this_local;
  
  ModuleLevelServiceDescriptorName_abi_cxx11_
            ((string *)((long)&service_options.field_2 + 8),this,service_descriptor);
  this_00 = ServiceDescriptor::options(service_descriptor);
  MessageLite::SerializeAsString_abi_cxx11_(&local_78,(MessageLite *)this_00);
  OptionsValue((string *)local_58,this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"None");
  if (bVar1) {
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              ((string *)((long)&service_options.field_2 + 8),(string *)local_58,this->printer_);
  }
  for (method._0_4_ = 0; iVar2 = ServiceDescriptor::method_count(service_descriptor),
      (int)method < iVar2; method._0_4_ = (int)method + 1) {
    method_options.field_2._8_8_ = ServiceDescriptor::method(service_descriptor,(int)method);
    this_01 = MethodDescriptor::options((MethodDescriptor *)method_options.field_2._8_8_);
    MessageLite::SerializeAsString_abi_cxx11_
              ((string *)((long)&method_name.field_2 + 8),(MessageLite *)this_01);
    OptionsValue((string *)local_b0,this,(string *)((long)&method_name.field_2 + 8));
    std::__cxx11::string::~string((string *)(method_name.field_2._M_local_buf + 8));
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"None");
    if (bVar1) {
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&service_options.field_2 + 8),".methods_by_name[\'");
      __rhs = MethodDescriptor::name_abi_cxx11_((MethodDescriptor *)method_options.field_2._8_8_);
      std::operator+(&local_110,&local_130,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     &local_110,"\']");
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      anon_unknown_0::PrintDescriptorOptionsFixingCode
                ((string *)local_f0,(string *)local_b0,this->printer_);
      std::__cxx11::string::~string((string *)local_f0);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(service_options.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Generator::FixOptionsForService(
    const ServiceDescriptor& service_descriptor) const {
  std::string descriptor_name =
      ModuleLevelServiceDescriptorName(service_descriptor);
  std::string service_options =
      OptionsValue(service_descriptor.options().SerializeAsString());
  if (service_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, service_options,
                                     printer_);
  }

  for (int i = 0; i < service_descriptor.method_count(); ++i) {
    const MethodDescriptor* method = service_descriptor.method(i);
    std::string method_options =
        OptionsValue(method->options().SerializeAsString());
    if (method_options != "None") {
      std::string method_name =
          descriptor_name + ".methods_by_name['" + method->name() + "']";
      PrintDescriptorOptionsFixingCode(method_name, method_options, printer_);
    }
  }
}